

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

off_t knet_seek(knetFile *fp,off_t off,int whence)

{
  FILE *__stream;
  __off_t _Var1;
  int *piVar2;
  char *pcVar3;
  off_t offset;
  int whence_local;
  off_t off_local;
  knetFile *fp_local;
  
  if ((whence == 0) && (off == fp->offset)) {
    fp_local = (knetFile *)0x0;
  }
  else if (fp->type == 1) {
    _Var1 = lseek(fp->fd,off,whence);
    if (_Var1 == -1) {
      fp_local = (knetFile *)0xffffffffffffffff;
    }
    else {
      fp->offset = _Var1;
      fp_local = (knetFile *)fp->offset;
    }
  }
  else if (fp->type == 2) {
    if (whence == 1) {
      fp->offset = off + fp->offset;
    }
    else if (whence == 0) {
      fp->offset = off;
    }
    else {
      if (whence != 2) {
        return -1;
      }
      fp->offset = fp->file_size + off;
    }
    fp->is_ready = 0;
    fp_local = (knetFile *)fp->offset;
  }
  else if (fp->type == 3) {
    if (whence == 2) {
      fprintf(_stderr,"[knet_seek] SEEK_END is not supported for HTTP. Offset is unchanged.\n");
      piVar2 = __errno_location();
      *piVar2 = 0x1d;
      fp_local = (knetFile *)0xffffffffffffffff;
    }
    else {
      if (whence == 1) {
        fp->offset = off + fp->offset;
      }
      else {
        if (whence != 0) {
          return -1;
        }
        fp->offset = off;
      }
      fp->is_ready = 0;
      fp_local = (knetFile *)fp->offset;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    __stream = _stderr;
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"[knet_seek] %s\n",pcVar3);
    fp_local = (knetFile *)0xffffffffffffffff;
  }
  return (off_t)fp_local;
}

Assistant:

off_t knet_seek(knetFile *fp, off_t off, int whence)
{
	if (whence == SEEK_SET && off == fp->offset) return 0;
	if (fp->type == KNF_TYPE_LOCAL) {
		/* Be aware that lseek() returns the offset after seeking, while fseek() returns zero on success. */
		off_t offset = lseek(fp->fd, off, whence);
		if (offset == -1) return -1;
		fp->offset = offset;
		return fp->offset;
	} else if (fp->type == KNF_TYPE_FTP) {
		if (whence == SEEK_CUR) fp->offset += off;
		else if (whence == SEEK_SET) fp->offset = off;
		else if (whence == SEEK_END) fp->offset = fp->file_size + off;
		else return -1;
		fp->is_ready = 0;
		return fp->offset;
	} else if (fp->type == KNF_TYPE_HTTP) {
		if (whence == SEEK_END) { // FIXME: can we allow SEEK_END in future?
			fprintf(stderr, "[knet_seek] SEEK_END is not supported for HTTP. Offset is unchanged.\n");
			errno = ESPIPE;
			return -1;
		}
		if (whence == SEEK_CUR) fp->offset += off;
		else if (whence == SEEK_SET) fp->offset = off;
		else return -1;
		fp->is_ready = 0;
		return fp->offset;
	}
	errno = EINVAL;
	fprintf(stderr,"[knet_seek] %s\n", strerror(errno));
	return -1;
}